

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

FilePath testing::internal::GetCurrentExecutableName(void)

{
  size_t extraout_RDX;
  FilePath *in_RDI;
  FilePath FVar2;
  FilePath result;
  String local_28;
  String local_18;
  size_t sVar1;
  
  local_28.c_str_ = (char *)operator_new__(1);
  *local_28.c_str_ = '\0';
  local_28.length_ = 0;
  FilePath::FilePath((FilePath *)&local_18,(String *)g_executable_path);
  String::operator=(&local_28,&local_18);
  if (local_18.c_str_ != (char *)0x0) {
    operator_delete__(local_18.c_str_);
  }
  FVar2 = FilePath::RemoveDirectoryName(in_RDI);
  sVar1 = FVar2.pathname_.length_;
  if (local_28.c_str_ != (char *)0x0) {
    operator_delete__(local_28.c_str_);
    sVar1 = extraout_RDX;
  }
  FVar2.pathname_.length_ = sVar1;
  FVar2.pathname_.c_str_ = (char *)in_RDI;
  return (FilePath)FVar2.pathname_;
}

Assistant:

FilePath GetCurrentExecutableName() {
  FilePath result;

#if GTEST_OS_WINDOWS
  result.Set(FilePath(g_executable_path).RemoveExtension("exe"));
#else
  result.Set(FilePath(g_executable_path));
#endif  // GTEST_OS_WINDOWS

  return result.RemoveDirectoryName();
}